

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::InsideExpressionSyntax::setChild
          (InsideExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  RangeListSyntax *pRVar1;
  SyntaxNode *pSVar2;
  Token TVar3;
  
  if (index == 2) {
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pRVar1 = (RangeListSyntax *)0x0;
    }
    else {
      pRVar1 = (RangeListSyntax *)TokenOrSyntax::node(&child);
    }
    (this->ranges).ptr = pRVar1;
  }
  else if (index == 1) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->inside).kind = TVar3.kind;
    (this->inside).field_0x2 = TVar3._2_1_;
    (this->inside).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->inside).rawLen = TVar3.rawLen;
    (this->inside).info = TVar3.info;
  }
  else {
    pSVar2 = TokenOrSyntax::node(&child);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pSVar2 = (SyntaxNode *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
    }
    (this->expr).ptr = (ExpressionSyntax *)pSVar2;
  }
  return;
}

Assistant:

void InsideExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: inside = child.token(); return;
        case 2: ranges = child.node() ? &child.node()->as<RangeListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}